

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall luna::State::State(State *this)

{
  Table *pTVar1;
  ModuleManager *this_00;
  State *in_RDI;
  Value v;
  Value k;
  type root;
  pointer in_stack_fffffffffffffe88;
  StringPool *in_stack_fffffffffffffe90;
  State *key;
  RootTravelType *in_stack_fffffffffffffe98;
  GC *in_stack_fffffffffffffea0;
  Stack *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  undefined1 log;
  GCObjectDeleter *in_stack_fffffffffffffec8;
  GC *this_01;
  Value *value;
  State *state;
  Table *this_02;
  anon_union_8_9_8deb4486_for_Value_0 local_d8;
  undefined4 local_d0;
  anon_union_8_9_8deb4486_for_Value_0 local_c8;
  undefined4 local_c0;
  code *local_70;
  undefined8 local_68;
  undefined1 local_41;
  
  log = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
  key = in_RDI;
  std::unique_ptr<luna::ModuleManager,std::default_delete<luna::ModuleManager>>::
  unique_ptr<std::default_delete<luna::ModuleManager>,void>
            ((unique_ptr<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_> *)
             in_stack_fffffffffffffe90);
  this_02 = (Table *)&in_RDI->string_pool_;
  std::unique_ptr<luna::StringPool,std::default_delete<luna::StringPool>>::
  unique_ptr<std::default_delete<luna::StringPool>,void>
            ((unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *)
             in_stack_fffffffffffffe90);
  std::unique_ptr<luna::GC,std::default_delete<luna::GC>>::
  unique_ptr<std::default_delete<luna::GC>,void>
            ((unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *)in_stack_fffffffffffffe90);
  CFunctionError::CFunctionError(&in_RDI->cfunc_error_);
  value = (Value *)&key->stack_;
  Stack::Stack(in_stack_fffffffffffffeb0);
  std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::list
            ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)0x167fa2);
  Value::Value(&key->global_);
  operator_new(0x70);
  StringPool::StringPool(in_stack_fffffffffffffe90);
  std::unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_>::reset
            ((unique_ptr<luna::StringPool,_std::default_delete<luna::StringPool>_> *)
             in_stack_fffffffffffffe90,(pointer)in_stack_fffffffffffffe88);
  operator_new(0x2e0);
  local_41 = 1;
  this_01 = (GC *)&stack0xffffffffffffffc8;
  std::function<void(luna::GCObject*,unsigned_int)>::function<luna::State::State()::__0,void>
            ((function<void_(luna::GCObject_*,_unsigned_int)> *)in_stack_fffffffffffffea0,
             (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffe98);
  GC::GC(this_01,in_stack_fffffffffffffec8,(bool)log);
  local_41 = 0;
  std::unique_ptr<luna::GC,_std::default_delete<luna::GC>_>::reset
            ((unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::function<void_(luna::GCObject_*,_unsigned_int)>::~function
            ((function<void_(luna::GCObject_*,_unsigned_int)> *)0x16807d);
  local_70 = FullGCRoot;
  local_68 = 0;
  std::bind<void(luna::State::*)(luna::GCObjectVisitor*),luna::State*,std::_Placeholder<1>const&>
            ((offset_in_State_to_subr *)in_stack_fffffffffffffe98,
             (State **)in_stack_fffffffffffffe90,(_Placeholder<1> *)in_stack_fffffffffffffe88);
  std::unique_ptr<luna::GC,_std::default_delete<luna::GC>_>::operator->
            ((unique_ptr<luna::GC,_std::default_delete<luna::GC>_> *)0x1680df);
  std::function<void(luna::GCObjectVisitor*)>::
  function<std::_Bind<void(luna::State::*(luna::State*,std::_Placeholder<1>))(luna::GCObjectVisitor*)>&,void>
            ((function<void_(luna::GCObjectVisitor_*)> *)in_stack_fffffffffffffea0,
             (_Bind<void_(luna::State::*(luna::State_*,_std::_Placeholder<1>))(luna::GCObjectVisitor_*)>
              *)in_stack_fffffffffffffe98);
  std::function<void(luna::GCObjectVisitor*)>::
  function<std::_Bind<void(luna::State::*(luna::State*,std::_Placeholder<1>))(luna::GCObjectVisitor*)>&,void>
            ((function<void_(luna::GCObjectVisitor_*)> *)in_stack_fffffffffffffea0,
             (_Bind<void_(luna::State::*(luna::State_*,_std::_Placeholder<1>))(luna::GCObjectVisitor_*)>
              *)in_stack_fffffffffffffe98);
  GC::SetRootTraveller
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (RootTravelType *)in_stack_fffffffffffffe90);
  std::function<void_(luna::GCObjectVisitor_*)>::~function
            ((function<void_(luna::GCObjectVisitor_*)> *)0x16813b);
  std::function<void_(luna::GCObjectVisitor_*)>::~function
            ((function<void_(luna::GCObjectVisitor_*)> *)0x168148);
  pTVar1 = NewTable((State *)0x168155);
  (key->global_).field_0.table_ = pTVar1;
  (key->global_).type_ = ValueT_Table;
  Value::Value((Value *)&local_c8);
  local_c0 = 4;
  local_c8.str_ = GetString((State *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  Value::Value((Value *)&local_d8);
  local_d0 = 7;
  local_d8.table_ = NewTable((State *)0x1681dd);
  Table::SetValue(this_02,(Value *)key,value);
  local_c0 = 4;
  local_c8.str_ = GetString((State *)in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  local_d0 = 7;
  local_d8.table_ = NewTable((State *)0x16825f);
  Table::SetValue(this_02,(Value *)key,value);
  state = key;
  this_00 = (ModuleManager *)operator_new(0x10);
  ModuleManager::ModuleManager(this_00,state,local_d8.table_);
  std::unique_ptr<luna::ModuleManager,_std::default_delete<luna::ModuleManager>_>::reset
            (&key->module_manager_,(pointer)in_stack_fffffffffffffe88);
  return;
}

Assistant:

State::State()
    {
        string_pool_.reset(new StringPool);

        // Init GC
        gc_.reset(new GC([&](GCObject *obj, unsigned int type) {
            if (type == GCObjectType_String)
            {
                string_pool_->DeleteString(static_cast<String *>(obj));
            }
            delete obj;
        }));
        auto root = std::bind(&State::FullGCRoot, this, std::placeholders::_1);
        gc_->SetRootTraveller(root, root);

        // New global table
        global_.table_ = NewTable();
        global_.type_ = ValueT_Table;

        // New table for store metatables
        Value k;
        k.type_ = ValueT_String;
        k.str_ = GetString(METATABLES);
        Value v;
        v.type_ = ValueT_Table;
        v.table_ = NewTable();
        global_.table_->SetValue(k, v);

        // New table for store modules
        k.type_ = ValueT_String;
        k.str_ = GetString(MODULES_TABLE);
        v.type_ = ValueT_Table;
        v.table_ = NewTable();
        global_.table_->SetValue(k, v);

        // Init module manager
        module_manager_.reset(new ModuleManager(this, v.table_));
    }